

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_qrdmlah_s16_aarch64(void *vd,void *vn,void *vm,void *ve,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  uVar3 = desc * 8 & 0xff;
  uVar1 = (ulong)(uVar3 + 8);
  uVar4 = 0;
  do {
    iVar5 = *(short *)((long)vd + uVar4) * 0x8000 +
            (int)*(short *)((long)vm + uVar4) * (int)*(short *)((long)vn + uVar4) + 0x4000;
    uVar6 = iVar5 >> 0xf;
    if ((int)(short)uVar6 != uVar6) {
      *(undefined4 *)((long)ve + 0x2e50) = 1;
      uVar6 = iVar5 >> 0x1f ^ 0x7fff;
    }
    *(short *)((long)vd + uVar4) = (short)uVar6;
    uVar4 = uVar4 + 2;
  } while (uVar1 != uVar4);
  uVar6 = desc >> 2 & 0xf8;
  if (uVar3 < uVar6) {
    uVar2 = (ulong)(uVar6 + 8);
    uVar4 = uVar1 + 8;
    if (uVar1 + 8 < uVar2) {
      uVar4 = uVar2;
    }
    memset((void *)((long)vd + uVar1),0,(~uVar1 + uVar4 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_qrdmlah_s16)(void *vd, void *vn, void *vm,
                              void *ve, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    int16_t *d = vd;
    int16_t *n = vn;
    int16_t *m = vm;
    CPUARMState *env = ve;
    uintptr_t i;

    for (i = 0; i < opr_sz / 2; ++i) {
        d[i] = inl_qrdmlah_s16(env, n[i], m[i], d[i]);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}